

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::
emplace_back<slang::ast::OpaqueInstancePath::Entry>
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,Entry *args)

{
  pointer __src;
  pointer pEVar1;
  ulong uVar2;
  pointer pEVar3;
  pointer pEVar4;
  pointer pEVar5;
  long lVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  
  pEVar1 = this->data_;
  __src = pEVar1 + this->len;
  if (this->len != this->cap) {
    __src->value = args->value;
    sVar8 = this->len;
    this->len = sVar8 + 1;
    return pEVar1 + sVar8;
  }
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar2 = this->cap;
  if (uVar9 < uVar2 * 2) {
    uVar9 = uVar2 * 2;
  }
  if (0xfffffffffffffff - uVar2 < uVar2) {
    uVar9 = 0xfffffffffffffff;
  }
  lVar7 = (long)__src - (long)this->data_;
  pEVar3 = (pointer)operator_new(uVar9 * 8);
  *(uintptr_t *)((long)pEVar3 + lVar7) = args->value;
  pEVar1 = this->data_;
  sVar8 = this->len;
  lVar6 = (long)pEVar1 + (sVar8 * 8 - (long)__src);
  pEVar4 = pEVar1;
  pEVar5 = pEVar3;
  if (lVar6 == 0) {
    pEVar4 = pEVar3;
    pEVar5 = pEVar1;
    if (sVar8 != 0) {
      do {
        pEVar4->value = pEVar5->value;
        pEVar5 = pEVar5 + 1;
        pEVar4 = pEVar4 + 1;
      } while (pEVar5 != __src);
    }
  }
  else {
    for (; pEVar4 != __src; pEVar4 = pEVar4 + 1) {
      pEVar5->value = pEVar4->value;
      pEVar5 = pEVar5 + 1;
    }
    memcpy((void *)((long)pEVar3 + lVar7 + 8),__src,(lVar6 - 8U & 0xfffffffffffffff8) + 8);
  }
  if (pEVar1 != (pointer)this->firstElement) {
    operator_delete(pEVar1);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar9;
  this->data_ = pEVar3;
  return (reference)((long)pEVar3 + lVar7);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }